

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O2

void test_bson_utf8_from_unichar(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  uint32_t len;
  char str [6];
  
  bson_utf8_from_unichar(0,str,&len);
  if (len == 1) {
    bson_utf8_from_unichar(0x80,str,&len);
    if (len == 2) {
      bson_utf8_from_unichar(0x800,str,&len);
      if (len == 3) {
        bson_utf8_from_unichar(0x10000,str,&len);
        if (len == 4) {
          bson_utf8_from_unichar(0x200000,str,&len);
          if (len == 5) {
            bson_utf8_from_unichar(0x4000000,str,&len);
            if (len == 6) {
              bson_utf8_from_unichar(0x7f,str,&len);
              if (len == 1) {
                bson_utf8_from_unichar(0x7ff,str,&len);
                if (len == 2) {
                  bson_utf8_from_unichar(0xffff,str,&len);
                  if (len == 3) {
                    bson_utf8_from_unichar(0x1fffff,str,&len);
                    if (len == 4) {
                      bson_utf8_from_unichar(0x3ffffff,str,&len);
                      if (len == 5) {
                        bson_utf8_from_unichar(0x7fffffff,str,&len);
                        if (len == 6) {
                          bson_utf8_from_unichar(0xd7ff,str,&len);
                          if (len == 3) {
                            bson_utf8_from_unichar(0xe000,str,&len);
                            if (len == 3) {
                              bson_utf8_from_unichar(0xfffd,str,&len);
                              if (len == 3) {
                                bson_utf8_from_unichar(0x10ffff,str,&len);
                                if (len == 4) {
                                  bson_utf8_from_unichar(0x110000,str,&len);
                                  if (len == 4) {
                                    bson_utf8_from_unichar(0x61,str,&len);
                                    if (len == 1) {
                                      if (str[0] == 'a') {
                                        bson_utf8_from_unichar(0xff,str,&len);
                                        if (len == 2) {
                                          if (str._0_2_ == -0x403d) {
                                            bson_utf8_from_unichar(0x20ac,str,&len);
                                            if (len == 3) {
                                              iVar1 = bcmp(test_bson_utf8_from_unichar::test3,str,3)
                                              ;
                                              if (iVar1 == 0) {
                                                return;
                                              }
                                              pcVar3 = "!memcmp ((const char *) test3, str, 3)";
                                              uVar2 = 0xcd;
                                            }
                                            else {
                                              pcVar3 = "len == 3";
                                              uVar2 = 0xcc;
                                            }
                                          }
                                          else {
                                            pcVar3 = "!memcmp ((const char *) test2, str, 2)";
                                            uVar2 = 0xc9;
                                          }
                                        }
                                        else {
                                          pcVar3 = "len == 2";
                                          uVar2 = 200;
                                        }
                                      }
                                      else {
                                        pcVar3 = "!memcmp (test1, str, 1)";
                                        uVar2 = 0xc5;
                                      }
                                    }
                                    else {
                                      pcVar3 = "len == 1";
                                      uVar2 = 0xc4;
                                    }
                                  }
                                  else {
                                    pcVar3 = "len == 4";
                                    uVar2 = 0xc1;
                                  }
                                }
                                else {
                                  pcVar3 = "len == 4";
                                  uVar2 = 0xbf;
                                }
                              }
                              else {
                                pcVar3 = "len == 3";
                                uVar2 = 0xbd;
                              }
                            }
                            else {
                              pcVar3 = "len == 3";
                              uVar2 = 0xbb;
                            }
                          }
                          else {
                            pcVar3 = "len == 3";
                            uVar2 = 0xb9;
                          }
                        }
                        else {
                          pcVar3 = "len == 6";
                          uVar2 = 0xb3;
                        }
                      }
                      else {
                        pcVar3 = "len == 5";
                        uVar2 = 0xb1;
                      }
                    }
                    else {
                      pcVar3 = "len == 4";
                      uVar2 = 0xaf;
                    }
                  }
                  else {
                    pcVar3 = "len == 3";
                    uVar2 = 0xad;
                  }
                }
                else {
                  pcVar3 = "len == 2";
                  uVar2 = 0xab;
                }
              }
              else {
                pcVar3 = "len == 1";
                uVar2 = 0xa9;
              }
            }
            else {
              pcVar3 = "len == 6";
              uVar2 = 0xa3;
            }
          }
          else {
            pcVar3 = "len == 5";
            uVar2 = 0xa1;
          }
        }
        else {
          pcVar3 = "len == 4";
          uVar2 = 0x9f;
        }
      }
      else {
        pcVar3 = "len == 3";
        uVar2 = 0x9d;
      }
    }
    else {
      pcVar3 = "len == 2";
      uVar2 = 0x9b;
    }
  }
  else {
    pcVar3 = "len == 1";
    uVar2 = 0x99;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-utf8.c",
          uVar2,"test_bson_utf8_from_unichar",pcVar3);
  abort();
}

Assistant:

static void
test_bson_utf8_from_unichar (void)
{
   static const char test1[] = {'a'};
   static const unsigned char test2[] = {0xc3, 0xbf};
   static const unsigned char test3[] = {0xe2, 0x82, 0xac};
   uint32_t len;
   char str[6];

   /*
    * First possible sequence of a certain length.
    */
   bson_utf8_from_unichar (0, str, &len);
   BSON_ASSERT (len == 1);
   bson_utf8_from_unichar (0x00000080, str, &len);
   BSON_ASSERT (len == 2);
   bson_utf8_from_unichar (0x00000800, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x00010000, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x00200000, str, &len);
   BSON_ASSERT (len == 5);
   bson_utf8_from_unichar (0x04000000, str, &len);
   BSON_ASSERT (len == 6);

   /*
    * Last possible sequence of a certain length.
    */
   bson_utf8_from_unichar (0x0000007F, str, &len);
   BSON_ASSERT (len == 1);
   bson_utf8_from_unichar (0x000007FF, str, &len);
   BSON_ASSERT (len == 2);
   bson_utf8_from_unichar (0x0000FFFF, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x001FFFFF, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x03FFFFFF, str, &len);
   BSON_ASSERT (len == 5);
   bson_utf8_from_unichar (0x7FFFFFFF, str, &len);
   BSON_ASSERT (len == 6);

   /*
    * Other interesting values.
    */
   bson_utf8_from_unichar (0x0000D7FF, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0000E000, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0000FFFD, str, &len);
   BSON_ASSERT (len == 3);
   bson_utf8_from_unichar (0x0010FFFF, str, &len);
   BSON_ASSERT (len == 4);
   bson_utf8_from_unichar (0x00110000, str, &len);
   BSON_ASSERT (len == 4);

   bson_utf8_from_unichar ('a', str, &len);
   BSON_ASSERT (len == 1);
   BSON_ASSERT (!memcmp (test1, str, 1));

   bson_utf8_from_unichar (0xFF, str, &len);
   BSON_ASSERT (len == 2);
   BSON_ASSERT (!memcmp ((const char *) test2, str, 2));

   bson_utf8_from_unichar (0x20AC, str, &len);
   BSON_ASSERT (len == 3);
   BSON_ASSERT (!memcmp ((const char *) test3, str, 3));
}